

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_queries.cpp
# Opt level: O1

string * __thiscall
duckdb::PragmaCopyDatabase_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,ClientContext *context,
          FunctionParameters *parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  const_reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string copy_stmt;
  string local_88;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  string local_48;
  
  local_68 = local_58;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"COPY FROM DATABASE ","");
  pvVar2 = vector<duckdb::Value,_true>::operator[]((vector<duckdb::Value,_true> *)context,0);
  Value::ToString_abi_cxx11_(&local_48,pvVar2);
  KeywordHelper::WriteOptionallyQuoted(&local_88,&local_48,'\"',true);
  ::std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88._M_dataplus._M_p);
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)&local_68);
  pvVar2 = vector<duckdb::Value,_true>::operator[]((vector<duckdb::Value,_true> *)context,1);
  Value::ToString_abi_cxx11_(&local_48,pvVar2);
  KeywordHelper::WriteOptionallyQuoted(&local_88,&local_48,'\"',true);
  ::std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  ::std::__cxx11::string::append((char *)&local_88);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  ::std::__cxx11::string::append((char *)&local_88);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

string PragmaCopyDatabase(ClientContext &context, const FunctionParameters &parameters) {
	string copy_stmt = "COPY FROM DATABASE ";
	copy_stmt += KeywordHelper::WriteOptionallyQuoted(parameters.values[0].ToString());
	copy_stmt += " TO ";
	copy_stmt += KeywordHelper::WriteOptionallyQuoted(parameters.values[1].ToString());
	string final_query;
	final_query += copy_stmt + " (SCHEMA);\n";
	final_query += copy_stmt + " (DATA);";
	return final_query;
}